

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vfs_register(sqlite3_vfs *pVfs,int makeDflt)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  sqlite3_vfs **ppsVar5;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    bVar1 = true;
    if ((sqlite3Config.bCoreMutex == 0) ||
       (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
      psVar3 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar3);
      bVar1 = false;
    }
    vfsUnlink(pVfs);
    if (vfsList == (sqlite3_vfs *)0x0 || makeDflt != 0) {
      ppsVar5 = &vfsList;
      psVar4 = vfsList;
    }
    else {
      ppsVar5 = &vfsList->pNext;
      psVar4 = vfsList->pNext;
    }
    pVfs->pNext = psVar4;
    *ppsVar5 = pVfs;
    if (!bVar1) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar3);
    }
    return 0;
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_vfs_register(sqlite3_vfs *pVfs, int makeDflt){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pVfs==0 ) return SQLITE_MISUSE_BKPT;
#endif

  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  if( makeDflt || vfsList==0 ){
    pVfs->pNext = vfsList;
    vfsList = pVfs;
  }else{
    pVfs->pNext = vfsList->pNext;
    vfsList->pNext = pVfs;
  }
  assert(vfsList);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}